

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureHandler.cxx
# Opt level: O2

int __thiscall cmCTestConfigureHandler::ProcessHandler(cmCTestConfigureHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  allocator<char> local_735;
  int retVal;
  string local_730;
  time_point start_time_time;
  string cCommand;
  cmXMLWriter xml;
  string output;
  string buildDirectory;
  ostringstream cmCTestLog_msg_5;
  string start_time;
  ostringstream cmCTestLog_msg;
  byte abStack_498 [552];
  cmGeneratedFileStream ofs;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Configure project");
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
               ,0x1a,(char *)ofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                             _vptr_basic_ostream,(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&ofs);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"ConfigureCommand",(allocator<char> *)&ofs);
  cmCTest::GetCTestConfiguration(&cCommand,pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (cCommand._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,
                             "Cannot find ConfigureCommand key in the DartConfiguration.tcl");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                 ,0x20,(char *)ofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>
                               ._vptr_basic_ostream,false);
    std::__cxx11::string::~string((string *)&ofs);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    iVar3 = -1;
    goto LAB_0015a089;
  }
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"BuildDirectory",(allocator<char> *)&ofs);
  cmCTest::GetCTestConfiguration(&buildDirectory,pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (buildDirectory._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,
                             "Cannot find BuildDirectory  key in the DartConfiguration.tcl");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                 ,0x29,(char *)ofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>
                               ._vptr_basic_ostream,false);
    std::__cxx11::string::~string((string *)&ofs);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    iVar3 = -1;
  }
  else {
    lVar5 = std::chrono::_V2::steady_clock::now();
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    retVal = 0;
    bVar2 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Configure with command: ");
      poVar4 = std::operator<<(poVar4,(string *)&cCommand);
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      iVar3 = 0;
      cmCTest::Log(pcVar1,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                   ,0x5f,(char *)ofs.super_ofstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream,(this->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)&ofs);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
LAB_00159fda:
      if ((iVar3 == 0) || (iVar3 = 0, retVal != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Error(s) when configuring the project")
        ;
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,99,(char *)ofs.super_ofstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream,false);
        std::__cxx11::string::~string((string *)&ofs);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        iVar3 = -1;
      }
    }
    else {
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&cmCTestLog_msg,None);
      bVar2 = cmCTestGenericHandler::StartResultingXML
                        (&this->super_cmCTestGenericHandler,PartConfigure,"Configure",
                         (cmGeneratedFileStream *)&cmCTestLog_msg);
      if (bVar2) {
        cmCTest::CurrentTime_abi_cxx11_(&start_time,(this->super_cmCTestGenericHandler).CTest);
        start_time_time.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        cmGeneratedFileStream::cmGeneratedFileStream(&ofs,None);
        cmCTestGenericHandler::StartLogFile(&this->super_cmCTestGenericHandler,"Configure",&ofs);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_5);
        poVar4 = std::operator<<((ostream *)&cmCTestLog_msg_5,"Configure with command: ");
        poVar4 = std::operator<<(poVar4,(string *)&cCommand);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,0x3f,(char *)xml.Output,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&xml);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_5);
        iVar3 = cmCTest::RunMakeCommand
                          ((this->super_cmCTestGenericHandler).CTest,&cCommand,&output,&retVal,
                           buildDirectory._M_dataplus._M_p,(cmDuration)0x0,(ostream *)&ofs,Auto);
        if (((&ofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
             [(long)ofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream[-3]] & 5) == 0) {
          std::ofstream::close();
        }
        if ((abStack_498[*(long *)(_cmCTestLog_msg + -0x18)] & 5) == 0) {
          cmXMLWriter::cmXMLWriter(&xml,(ostream *)&cmCTestLog_msg,0);
          cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,&xml,
                            (this->super_cmCTestGenericHandler).AppendXML);
          cmCTest::GenerateSubprojectsOutput((this->super_cmCTestGenericHandler).CTest,&xml);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCTestLog_msg_5,"Configure",(allocator<char> *)&local_730);
          cmXMLWriter::StartElement(&xml,(string *)&cmCTestLog_msg_5);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCTestLog_msg_5,"StartDateTime",(allocator<char> *)&local_730);
          cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg_5,&start_time);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCTestLog_msg_5,"StartConfigureTime",(allocator<char> *)&local_730)
          ;
          cmXMLWriter::
          Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                    (&xml,(string *)&cmCTestLog_msg_5,&start_time_time);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCTestLog_msg_5,"ConfigureCommand",(allocator<char> *)&local_730);
          cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg_5,&cCommand);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_5);
          poVar4 = std::operator<<((ostream *)&cmCTestLog_msg_5,"End");
          std::endl<char,std::char_traits<char>>(poVar4);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                       ,0x50,local_730._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&local_730);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCTestLog_msg_5,"Log",(allocator<char> *)&local_730);
          cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg_5,&output);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCTestLog_msg_5,"ConfigureStatus",(allocator<char> *)&local_730);
          cmXMLWriter::Element<int>(&xml,(string *)&cmCTestLog_msg_5,&retVal);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCTestLog_msg_5,"EndDateTime",&local_735);
          cmCTest::CurrentTime_abi_cxx11_(&local_730,(this->super_cmCTestGenericHandler).CTest);
          cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg_5,&local_730);
          std::__cxx11::string::~string((string *)&local_730);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCTestLog_msg_5,"EndConfigureTime",&local_735);
          local_730._M_dataplus._M_p = (pointer)std::chrono::_V2::system_clock::now();
          cmXMLWriter::
          Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                    (&xml,(string *)&cmCTestLog_msg_5,
                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&local_730);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCTestLog_msg_5,"ElapsedMinutes",&local_735);
          lVar6 = std::chrono::_V2::steady_clock::now();
          local_730._M_dataplus._M_p = (pointer)((lVar6 - lVar5) / 60000000000);
          cmXMLWriter::Element<long>(&xml,(string *)&cmCTestLog_msg_5,(long *)&local_730);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
          cmXMLWriter::EndElement(&xml);
          cmCTest::EndXML((this->super_cmCTestGenericHandler).CTest,&xml);
          cmXMLWriter::~cmXMLWriter(&xml);
        }
        cmGeneratedFileStream::~cmGeneratedFileStream(&ofs);
        std::__cxx11::string::~string((string *)&start_time);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
        poVar4 = std::operator<<((ostream *)&ofs,"Cannot open configure file");
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        iVar3 = 0;
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,0x35,_cmCTestLog_msg_5,false);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&cmCTestLog_msg);
      if (bVar2) goto LAB_00159fda;
      iVar3 = 1;
    }
    std::__cxx11::string::~string((string *)&output);
  }
  std::__cxx11::string::~string((string *)&buildDirectory);
LAB_0015a089:
  std::__cxx11::string::~string((string *)&cCommand);
  return iVar3;
}

Assistant:

int cmCTestConfigureHandler::ProcessHandler()
{
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "Configure project" << std::endl, this->Quiet);
  std::string cCommand =
    this->CTest->GetCTestConfiguration("ConfigureCommand");
  if (cCommand.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find ConfigureCommand key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  std::string buildDirectory =
    this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  auto elapsed_time_start = std::chrono::steady_clock::now();
  std::string output;
  int retVal = 0;
  int res = 0;
  if (!this->CTest->GetShowOnly()) {
    cmGeneratedFileStream os;
    if (!this->StartResultingXML(cmCTest::PartConfigure, "Configure", os)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot open configure file" << std::endl);
      return 1;
    }
    std::string start_time = this->CTest->CurrentTime();
    auto start_time_time = std::chrono::system_clock::now();

    cmGeneratedFileStream ofs;
    this->StartLogFile("Configure", ofs);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Configure with command: " << cCommand << std::endl,
                       this->Quiet);
    res = this->CTest->RunMakeCommand(cCommand, output, &retVal,
                                      buildDirectory.c_str(),
                                      cmDuration::zero(), ofs);

    if (ofs) {
      ofs.close();
    }

    if (os) {
      cmXMLWriter xml(os);
      this->CTest->StartXML(xml, this->AppendXML);
      this->CTest->GenerateSubprojectsOutput(xml);
      xml.StartElement("Configure");
      xml.Element("StartDateTime", start_time);
      xml.Element("StartConfigureTime", start_time_time);
      xml.Element("ConfigureCommand", cCommand);
      cmCTestOptionalLog(this->CTest, DEBUG, "End" << std::endl, this->Quiet);
      xml.Element("Log", output);
      xml.Element("ConfigureStatus", retVal);
      xml.Element("EndDateTime", this->CTest->CurrentTime());
      xml.Element("EndConfigureTime", std::chrono::system_clock::now());
      xml.Element("ElapsedMinutes",
                  std::chrono::duration_cast<std::chrono::minutes>(
                    std::chrono::steady_clock::now() - elapsed_time_start)
                    .count());
      xml.EndElement(); // Configure
      this->CTest->EndXML(xml);
    }
  } else {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Configure with command: " << cCommand << std::endl,
                       this->Quiet);
  }
  if (!res || retVal) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error(s) when configuring the project" << std::endl);
    return -1;
  }
  return 0;
}